

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# for_each.cpp
# Opt level: O3

void for_each_test(void)

{
  return;
}

Assistant:

void for_each_test()
{
    // test regular cases
    auto r = brigand::for_each<brigand::list<char, short, int, double>>(value_printer{});
    assert(r.res == 64);
    assert(r.i == 4);

    // test with custom list
    auto r2 = brigand::for_each<custom_list<char, short, int, double>>(value_printer{});
    assert(r2.res == 64);
    assert(r2.i == 4);

    // test issues with comma operator
    brigand::for_each<brigand::list<char, void, int, double>>(evil{});

    r = brigand::for_each<brigand::list<evil, evil, evil>>(value_printer{});
    assert(r.res == 1);
    assert(r.i == 3);

    // Test for_each_args separately
    auto base10_result = brigand::for_each_args(base10{}, 1, 2, 3, 4).result;
    assert(base10_result == 1234);
}